

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O1

XFontStruct * __thiscall Am_Font_Data::Get_X_Font(Am_Font_Data *this,Am_Drawonable_Impl *d)

{
  undefined2 uVar1;
  Display *dpy;
  Font_Index *pFVar2;
  XFontStruct *pXVar3;
  short sVar4;
  XFontStruct *font_info;
  XFontStruct *local_20;
  
  dpy = d->screen->display;
  if (dpy == this->main_display) {
    pXVar3 = this->main_xfont;
  }
  else {
    for (pFVar2 = this->font_head; pFVar2 != (Font_Index *)0x0; pFVar2 = pFVar2->next) {
      if (pFVar2->dpy == dpy) {
        pXVar3 = pFVar2->xfont;
        goto LAB_002801ac;
      }
    }
    pXVar3 = (XFontStruct *)0x0;
LAB_002801ac:
    if (pFVar2 == (Font_Index *)0x0) {
      if (this->name == (char *)0x0) {
        initialize_standard_font(dpy,(int)d,this,&local_20);
      }
      else {
        initialize_font_from_file(dpy,(int)d,this->name,&local_20);
      }
      pXVar3 = local_20;
      if (this->main_display == (Display *)0x0) {
        this->main_display = dpy;
        this->main_xfont = local_20;
        uVar1 = (local_20->min_bounds).width;
        sVar4 = 0;
        if (uVar1 == (local_20->max_bounds).width) {
          sVar4 = uVar1;
        }
        this->char_width = (int)sVar4;
      }
      else {
        pFVar2 = (Font_Index *)operator_new(0x18);
        pFVar2->dpy = dpy;
        pFVar2->xfont = pXVar3;
        pFVar2->next = (Font_Index *)0x0;
        pFVar2->next = this->font_head;
        this->font_head = pFVar2;
        pXVar3 = local_20;
      }
    }
  }
  return pXVar3;
}

Assistant:

XFontStruct *
Am_Font_Data::Get_X_Font(const Am_Drawonable_Impl *d)
{
  Display *disp = d->Get_Display();
  XFontStruct *xfont;
  if (disp == main_display)
    return main_xfont;
  else if (Get_Font(disp, xfont))
    return xfont;
  else {
    XFontStruct *font_info;
    const char *font_name = Get_Font_Name();
    if (font_name == nullptr)
      initialize_standard_font(disp, d->screen->screen_number, this,
                               &font_info);
    else
      initialize_font_from_file(disp, d->screen->screen_number, font_name,
                                &font_info);

    if (main_display)
      Add_Font(disp, font_info);
    else {
      main_display = disp;
      main_xfont = font_info;
      // set char_width for fixed width fonts, on main display only
      char_width = (font_info->min_bounds.width == font_info->max_bounds.width)
                       ? font_info->min_bounds.width
                       : 0;
    }

    return font_info;
  }
}